

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O0

void dumb_remove_clicks(DUMB_CLICK_REMOVER *cr,sample_t_conflict *samples,int32 length,int step,
                       double halflife)

{
  DUMB_CLICK *pDVar1;
  int iVar2;
  int iVar3;
  DUMB_CLICK *cl;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  DUMB_CLICK_REMOVER *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  int end;
  DUMB_CLICK *next;
  int factor;
  int offset;
  int32 pos;
  DUMB_CLICK *click;
  int local_30;
  int n_clicks;
  DUMB_CLICK *in_stack_ffffffffffffffd8;
  
  n_clicks = 0;
  if (in_RDI != (DUMB_CLICK_REMOVER *)0x0) {
    dVar4 = pow(0.5,1.0 / in_XMM0_Qa);
    dVar4 = floor(dVar4 * 2147483648.0);
    iVar2 = (int)dVar4;
    cl = dumb_click_mergesort(in_stack_ffffffffffffffd8,n_clicks);
    in_RDI->click = (DUMB_CLICK *)0x0;
    in_RDI->n_clicks = 0;
    while (cl != (DUMB_CLICK *)0x0) {
      pDVar1 = cl->next;
      iVar3 = cl->pos * in_ECX;
      local_30 = in_RDI->offset;
      if (local_30 < 0) {
        local_30 = -local_30;
        for (; n_clicks < iVar3; n_clicks = in_ECX + n_clicks) {
          *(int *)(in_RSI + (long)n_clicks * 4) = *(int *)(in_RSI + (long)n_clicks * 4) - local_30;
          local_30 = (int)((ulong)((long)(local_30 << 1) * (long)iVar2) >> 0x20);
        }
        local_30 = -local_30;
      }
      else {
        for (; n_clicks < iVar3; n_clicks = in_ECX + n_clicks) {
          *(int *)(in_RSI + (long)n_clicks * 4) = local_30 + *(int *)(in_RSI + (long)n_clicks * 4);
          local_30 = (int)((ulong)((long)(local_30 << 1) * (long)iVar2) >> 0x20);
        }
      }
      in_RDI->offset = local_30 - cl->step;
      free_click(in_RDI,cl);
      cl = pDVar1;
    }
    local_30 = in_RDI->offset;
    if (local_30 < 0) {
      local_30 = -local_30;
      for (; n_clicks < in_ECX * in_EDX; n_clicks = in_ECX + n_clicks) {
        *(int *)(in_RSI + (long)n_clicks * 4) = *(int *)(in_RSI + (long)n_clicks * 4) - local_30;
        local_30 = (int)((ulong)((long)(local_30 << 1) * (long)iVar2) >> 0x20);
      }
      local_30 = -local_30;
    }
    else {
      for (; n_clicks < in_ECX * in_EDX; n_clicks = in_ECX + n_clicks) {
        *(int *)(in_RSI + (long)n_clicks * 4) = local_30 + *(int *)(in_RSI + (long)n_clicks * 4);
        local_30 = (int)((ulong)((long)(local_30 << 1) * (long)iVar2) >> 0x20);
      }
    }
    in_RDI->offset = local_30;
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_remove_clicks(DUMB_CLICK_REMOVER *cr, sample_t *samples, int32 length, int step, double halflife)
{
	DUMB_CLICK *click;
	int32 pos = 0;
	int offset;
	int factor;

	if (!cr) return;

	factor = (int)floor(pow(0.5, 1.0/halflife) * (1U << 31));

	click = dumb_click_mergesort(cr->click, cr->n_clicks);
	cr->click = NULL;
	cr->n_clicks = 0;

	length *= step;

	while (click) {
		DUMB_CLICK *next = click->next;
		int end = click->pos * step;
		ASSERT(end <= length);
		offset = cr->offset;
		if (offset < 0) {
			offset = -offset;
			while (pos < end) {
				samples[pos] -= offset;
				offset = (int)(((LONG_LONG)(offset << 1) * factor) >> 32);
				pos += step;
			}
			offset = -offset;
		} else {
			while (pos < end) {
				samples[pos] += offset;
				offset = (int)(((LONG_LONG)(offset << 1) * factor) >> 32);
				pos += step;
			}
		}
		cr->offset = offset - click->step;
		free_click(cr, click);
		click = next;
	}

	offset = cr->offset;
	if (offset < 0) {
		offset = -offset;
		while (pos < length) {
			samples[pos] -= offset;
			offset = (int)((LONG_LONG)(offset << 1) * factor >> 32);
			pos += step;
		}
		offset = -offset;
	} else {
		while (pos < length) {
			samples[pos] += offset;
			offset = (int)((LONG_LONG)(offset << 1) * factor >> 32);
			pos += step;
		}
	}
	cr->offset = offset;
}